

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string_view name,Symbol symbol)

{
  ctrl_t *pcVar1;
  ushort uVar2;
  ushort x;
  undefined1 auVar3 [16];
  bool bVar4;
  uint32_t uVar5;
  uint uVar6;
  Nonnull<const_char_*> failure_msg;
  CommonFields *common;
  SymbolByParentHash *this_00;
  EqualElement<google::protobuf::Symbol> *pEVar7;
  size_t sVar8;
  ctrl_t *pcVar9;
  slot_type *psVar10;
  int line;
  Symbol *ts;
  Symbol *ts_00;
  Symbol *ts_01;
  Symbol *ts_02;
  ulong extraout_RDX;
  SymbolByParentHash *pSVar11;
  Symbol *s;
  PolicyFunctions *in_R9;
  ushort uVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i match;
  ctrl_t cVar17;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  iterator iVar35;
  FindInfo target;
  probe_seq<16UL> seq;
  Symbol symbol_local;
  iterator local_a8;
  undefined8 local_98;
  ctrl_t cStack_90;
  ctrl_t cStack_8f;
  ctrl_t cStack_8e;
  ctrl_t cStack_8d;
  ctrl_t cStack_8c;
  ctrl_t cStack_8b;
  ctrl_t cStack_8a;
  ctrl_t cStack_89;
  undefined1 local_88 [16];
  void *parent_local;
  ctrl_t local_68;
  ctrl_t cStack_67;
  ctrl_t cStack_66;
  ctrl_t cStack_65;
  ctrl_t cStack_64;
  ctrl_t cStack_63;
  ctrl_t cStack_62;
  ctrl_t cStack_61;
  ctrl_t cStack_60;
  ctrl_t cStack_5f;
  ctrl_t cStack_5e;
  ctrl_t cStack_5d;
  ctrl_t cStack_5c;
  ctrl_t cStack_5b;
  ctrl_t cStack_5a;
  ctrl_t cStack_59;
  string_view name_local;
  iterator local_40;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  symbol_local = symbol;
  parent_local = parent;
  Symbol::parent_name_key
            ((pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)&seq,
             &symbol_local);
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                          (&name_local,
                           (basic_string_view<char,_std::char_traits<char>_> *)&seq.offset_,
                           "name == symbol.parent_name_key().second");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x899;
LAB_0012b604:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&seq,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&seq);
  }
  Symbol::parent_name_key
            ((pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)&seq,
             &symbol_local);
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<void_const*,void_const*>
                          (&parent_local,(void **)&seq,"parent == symbol.parent_name_key().first");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x89a;
    goto LAB_0012b604;
  }
  pSVar11 = (SymbolByParentHash *)&symbol_local;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::AssertOnFind<google::protobuf::Symbol>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              *)this,&symbol_local);
  bVar4 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this);
  if (bVar4) {
    bVar4 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     *)this);
    if (bVar4) {
      bVar4 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        *)this);
      if (!bVar4) {
        __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe3f,
                      "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::try_sample_soo() [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                     );
      }
      absl::lts_20250127::container_internal::CommonFields::set_full_soo((CommonFields *)this);
      iVar35 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
               ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                               *)this);
    }
    else {
      seq.offset_ = (size_t)this;
      seq.mask_ = (size_t)&symbol_local;
      pEVar7 = (EqualElement<google::protobuf::Symbol> *)
               absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
               ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                           *)this);
      bVar4 = absl::lts_20250127::container_internal::
              hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
              ::
              apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                        ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                          *)&seq,pEVar7,ts_00);
      if (bVar4) {
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        *)this);
        return false;
      }
      s = (Symbol *)0x3;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::resize_impl(this);
      sVar8 = (anonymous_namespace)::SymbolByParentHash::operator()
                        ((SymbolByParentHash *)&symbol_local,s);
      sVar8 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                        (sVar8,8,(CommonFields *)this);
      iVar35 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                              *)this,sVar8);
    }
  }
  else {
    bVar4 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)this);
    if (bVar4) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf66,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                   );
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
    ::prefetch_heap_block
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)this);
    common = (CommonFields *)
             (anonymous_namespace)::SymbolByParentHash::operator()
                       ((SymbolByParentHash *)&symbol_local,(Symbol *)pSVar11);
    absl::lts_20250127::container_internal::probe(&seq,(CommonFields *)this,(size_t)common);
    pcVar9 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
             ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        *)this);
    auVar15 = ZEXT216(CONCAT11((char)common,(char)common) & 0x7f7f);
    auVar15 = pshuflw(auVar15,auVar15,0);
    uVar14 = auVar15._0_4_;
    local_88._4_4_ = uVar14;
    local_88._0_4_ = uVar14;
    local_88._8_4_ = uVar14;
    local_88._12_4_ = uVar14;
    while( true ) {
      pcVar1 = pcVar9 + seq.offset_;
      auVar15[0] = -(local_88[0] == *pcVar1);
      auVar15[1] = -(local_88[1] == pcVar1[1]);
      auVar15[2] = -(local_88[2] == pcVar1[2]);
      auVar15[3] = -(local_88[3] == pcVar1[3]);
      auVar15[4] = -(local_88[4] == pcVar1[4]);
      auVar15[5] = -(local_88[5] == pcVar1[5]);
      auVar15[6] = -(local_88[6] == pcVar1[6]);
      auVar15[7] = -(local_88[7] == pcVar1[7]);
      auVar15[8] = -(local_88[8] == pcVar1[8]);
      auVar15[9] = -(local_88[9] == pcVar1[9]);
      auVar15[10] = -(local_88[10] == pcVar1[10]);
      auVar15[0xb] = -(local_88[0xb] == pcVar1[0xb]);
      auVar15[0xc] = -(local_88[0xc] == pcVar1[0xc]);
      auVar15[0xd] = -(local_88[0xd] == pcVar1[0xd]);
      auVar15[0xe] = -(local_88[0xe] == pcVar1[0xe]);
      auVar15[0xf] = -(local_88[0xf] == pcVar1[0xf]);
      cVar17 = *pcVar1;
      cVar20 = pcVar1[1];
      cVar21 = pcVar1[2];
      cVar22 = pcVar1[3];
      cVar23 = pcVar1[4];
      cVar24 = pcVar1[5];
      cVar25 = pcVar1[6];
      cVar26 = pcVar1[7];
      cVar27 = pcVar1[8];
      cVar28 = pcVar1[9];
      cVar29 = pcVar1[10];
      cVar30 = pcVar1[0xb];
      cVar31 = pcVar1[0xc];
      cVar32 = pcVar1[0xd];
      cVar33 = pcVar1[0xe];
      cVar34 = pcVar1[0xf];
      for (uVar12 = (ushort)(SUB161(auVar15 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar15[0xf] >> 7) << 0xf; uVar12 != 0; uVar12 = uVar12 - 1 & uVar12) {
        local_98 = (ctrl_t *)
                   CONCAT17(cVar26,CONCAT16(cVar25,CONCAT15(cVar24,CONCAT14(cVar23,CONCAT13(cVar22,
                                                  CONCAT12(cVar21,CONCAT11(cVar20,cVar17)))))));
        cStack_90 = cVar27;
        cStack_8f = cVar28;
        cStack_8e = cVar29;
        cStack_8d = cVar30;
        cStack_8c = cVar31;
        cStack_8b = cVar32;
        cStack_8a = cVar33;
        cStack_89 = cVar34;
        uVar5 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar12);
        local_a8.field_1.slot_ = (slot_type *)this;
        local_a8.ctrl_ = (ctrl_t *)&symbol_local;
        psVar10 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this);
        bVar4 = absl::lts_20250127::container_internal::
                hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                ::
                apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                          ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                            *)&local_a8,
                           (EqualElement<google::protobuf::Symbol> *)
                           (psVar10 + (seq.offset_ + uVar5 & seq.mask_)),ts);
        if (bVar4) {
          sVar8 = uVar5 + seq.offset_ & seq.mask_;
          goto LAB_0012b269;
        }
        cVar17 = (ctrl_t)local_98;
        cVar20 = local_98._1_1_;
        cVar21 = local_98._2_1_;
        cVar22 = local_98._3_1_;
        cVar23 = local_98._4_1_;
        cVar24 = local_98._5_1_;
        cVar25 = local_98._6_1_;
        cVar26 = local_98._7_1_;
        cVar27 = cStack_90;
        cVar28 = cStack_8f;
        cVar29 = cStack_8e;
        cVar30 = cStack_8d;
        cVar31 = cStack_8c;
        cVar32 = cStack_8b;
        cVar33 = cStack_8a;
        cVar34 = cStack_89;
      }
      auVar18[0] = -(cVar17 == kEmpty);
      auVar18[1] = -(cVar20 == kEmpty);
      auVar18[2] = -(cVar21 == kEmpty);
      auVar18[3] = -(cVar22 == kEmpty);
      auVar18[4] = -(cVar23 == kEmpty);
      auVar18[5] = -(cVar24 == kEmpty);
      auVar18[6] = -(cVar25 == kEmpty);
      auVar18[7] = -(cVar26 == kEmpty);
      auVar18[8] = -(cVar27 == kEmpty);
      auVar18[9] = -(cVar28 == kEmpty);
      auVar18[10] = -(cVar29 == kEmpty);
      auVar18[0xb] = -(cVar30 == kEmpty);
      auVar18[0xc] = -(cVar31 == kEmpty);
      auVar18[0xd] = -(cVar32 == kEmpty);
      auVar18[0xe] = -(cVar33 == kEmpty);
      auVar18[0xf] = -(cVar34 == kEmpty);
      x = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf;
      if (x != 0) break;
      uVar13 = seq.index_ + 0x10;
      seq.offset_ = seq.offset_ + uVar13 & seq.mask_;
      seq.index_ = uVar13;
      sVar8 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                          *)this);
      if (sVar8 < uVar13) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                     );
      }
    }
    sVar8 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        *)this);
    pcVar9 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
             ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        *)this);
    bVar4 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                      (sVar8,(size_t)common,pcVar9);
    if (bVar4) {
      uVar2 = 0xf;
      if (x != 0) {
        for (; x >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar6 = (ushort)((uVar2 ^ 0xfff0) + 0x11) - 1;
    }
    else {
      uVar6 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(x);
    }
    target.probe_length =
         (size_t)absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>
                 ::GetPolicyFunctions()::value;
    target.offset = seq.index_;
    sVar8 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                      ((container_internal *)this,common,uVar6 + seq.offset_ & seq.mask_,target,
                       in_R9);
LAB_0012b269:
    iVar35 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
             ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                            *)this,sVar8);
    if (uVar12 != 0) {
      return false;
    }
  }
  sVar8 = (this->symbols_by_parent_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  (this->symbols_by_parent_).
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9c;
  (iVar35.field_1.slot_)->ptr_ = symbol_local.ptr_;
  local_40 = iVar35;
  absl::lts_20250127::container_internal::CommonFields::set_capacity((CommonFields *)this,sVar8);
  this_00 = (SymbolByParentHash *)
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::iterator::operator*(&local_40);
  pSVar11 = this_00;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::AssertOnFind<google::protobuf::Symbol>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              *)this,(Symbol *)this_00);
  bVar4 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this);
  if (bVar4) {
    bVar4 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)this);
    if (!bVar4) {
      __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe21,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                   );
    }
    bVar4 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     *)this);
    if (!bVar4) {
      seq.offset_ = (size_t)this;
      seq.mask_ = (size_t)this_00;
      pEVar7 = (EqualElement<google::protobuf::Symbol> *)
               absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
               ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                           *)this);
      bVar4 = absl::lts_20250127::container_internal::
              hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
              ::
              apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                        ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                          *)&seq,pEVar7,ts_01);
      if (bVar4) {
        seq._0_16_ = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     ::soo_iterator((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                     *)this);
        goto LAB_0012b531;
      }
    }
  }
  else {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
    ::prefetch_heap_block
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)this);
    sVar8 = (anonymous_namespace)::SymbolByParentHash::operator()(this_00,(Symbol *)pSVar11);
    bVar4 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)this);
    if (bVar4) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe2a,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                   );
    }
    absl::lts_20250127::container_internal::probe(&seq,(CommonFields *)this,sVar8);
    pcVar9 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
             ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        *)this);
    auVar15 = ZEXT216(CONCAT11((char)sVar8,(char)sVar8) & 0x7f7f);
    auVar15 = pshuflw(auVar15,auVar15,0);
    uVar14 = auVar15._0_4_;
    local_88._4_4_ = uVar14;
    local_88._0_4_ = uVar14;
    local_88._8_4_ = uVar14;
    local_88._12_4_ = uVar14;
    while( true ) {
      pcVar1 = pcVar9 + seq.offset_;
      auVar16[0] = -(local_88[0] == *pcVar1);
      auVar16[1] = -(local_88[1] == pcVar1[1]);
      auVar16[2] = -(local_88[2] == pcVar1[2]);
      auVar16[3] = -(local_88[3] == pcVar1[3]);
      auVar16[4] = -(local_88[4] == pcVar1[4]);
      auVar16[5] = -(local_88[5] == pcVar1[5]);
      auVar16[6] = -(local_88[6] == pcVar1[6]);
      auVar16[7] = -(local_88[7] == pcVar1[7]);
      auVar16[8] = -(local_88[8] == pcVar1[8]);
      auVar16[9] = -(local_88[9] == pcVar1[9]);
      auVar16[10] = -(local_88[10] == pcVar1[10]);
      auVar16[0xb] = -(local_88[0xb] == pcVar1[0xb]);
      auVar16[0xc] = -(local_88[0xc] == pcVar1[0xc]);
      auVar16[0xd] = -(local_88[0xd] == pcVar1[0xd]);
      auVar16[0xe] = -(local_88[0xe] == pcVar1[0xe]);
      auVar16[0xf] = -(local_88[0xf] == pcVar1[0xf]);
      cVar17 = *pcVar1;
      cVar20 = pcVar1[1];
      cVar21 = pcVar1[2];
      cVar22 = pcVar1[3];
      cVar23 = pcVar1[4];
      cVar24 = pcVar1[5];
      cVar25 = pcVar1[6];
      cVar26 = pcVar1[7];
      cVar27 = pcVar1[8];
      cVar28 = pcVar1[9];
      cVar29 = pcVar1[10];
      cVar30 = pcVar1[0xb];
      cVar31 = pcVar1[0xc];
      cVar32 = pcVar1[0xd];
      cVar33 = pcVar1[0xe];
      cVar34 = pcVar1[0xf];
      for (uVar12 = (ushort)(SUB161(auVar16 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar16[0xf] >> 7) << 0xf; uVar12 != 0; uVar12 = uVar12 - 1 & uVar12) {
        local_98 = pcVar9;
        local_68 = cVar17;
        cStack_67 = cVar20;
        cStack_66 = cVar21;
        cStack_65 = cVar22;
        cStack_64 = cVar23;
        cStack_63 = cVar24;
        cStack_62 = cVar25;
        cStack_61 = cVar26;
        cStack_60 = cVar27;
        cStack_5f = cVar28;
        cStack_5e = cVar29;
        cStack_5d = cVar30;
        cStack_5c = cVar31;
        cStack_5b = cVar32;
        cStack_5a = cVar33;
        cStack_59 = cVar34;
        uVar5 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar12);
        local_a8.field_1.slot_ = (slot_type *)this;
        local_a8.ctrl_ = (ctrl_t *)this_00;
        psVar10 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this);
        bVar4 = absl::lts_20250127::container_internal::
                hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                ::
                apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                          ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                            *)&local_a8,
                           (EqualElement<google::protobuf::Symbol> *)
                           (psVar10 + (seq.offset_ + uVar5 & seq.mask_)),ts_02);
        if (bVar4) {
          seq._0_16_ = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                      *)this,uVar5 + seq.offset_ & seq.mask_);
          goto LAB_0012b531;
        }
        pcVar9 = local_98;
        cVar17 = local_68;
        cVar20 = cStack_67;
        cVar21 = cStack_66;
        cVar22 = cStack_65;
        cVar23 = cStack_64;
        cVar24 = cStack_63;
        cVar25 = cStack_62;
        cVar26 = cStack_61;
        cVar27 = cStack_60;
        cVar28 = cStack_5f;
        cVar29 = cStack_5e;
        cVar30 = cStack_5d;
        cVar31 = cStack_5c;
        cVar32 = cStack_5b;
        cVar33 = cStack_5a;
        cVar34 = cStack_59;
      }
      auVar19[0] = -(cVar17 == kEmpty);
      auVar19[1] = -(cVar20 == kEmpty);
      auVar19[2] = -(cVar21 == kEmpty);
      auVar19[3] = -(cVar22 == kEmpty);
      auVar19[4] = -(cVar23 == kEmpty);
      auVar19[5] = -(cVar24 == kEmpty);
      auVar19[6] = -(cVar25 == kEmpty);
      auVar19[7] = -(cVar26 == kEmpty);
      auVar19[8] = -(cVar27 == kEmpty);
      auVar19[9] = -(cVar28 == kEmpty);
      auVar19[10] = -(cVar29 == kEmpty);
      auVar19[0xb] = -(cVar30 == kEmpty);
      auVar19[0xc] = -(cVar31 == kEmpty);
      auVar19[0xd] = -(cVar32 == kEmpty);
      auVar19[0xe] = -(cVar33 == kEmpty);
      auVar19[0xf] = -(cVar34 == kEmpty);
      if ((((((((((((((((auVar19 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar19 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar19 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar19 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar19 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar19 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar19 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar19 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar19 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar19 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar19 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar19 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar34 == kEmpty)
      break;
      uVar13 = seq.index_ + 0x10;
      seq.offset_ = seq.offset_ + uVar13 & seq.mask_;
      seq.index_ = uVar13;
      sVar8 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                          *)this);
      if (sVar8 < uVar13) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                     );
      }
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              *)this);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = extraout_RDX;
  seq._0_16_ = auVar3 << 0x40;
LAB_0012b531:
  local_a8 = iVar35;
  bVar4 = absl::lts_20250127::container_internal::operator==
                    ((const_iterator *)&seq,(const_iterator *)&local_a8);
  if (!bVar4) {
    __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xfe2,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, Args = <const google::protobuf::Symbol &>]"
                 );
  }
  return true;
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               absl::string_view name,
                                               Symbol symbol) {
  ABSL_DCHECK_EQ(name, symbol.parent_name_key().second);
  ABSL_DCHECK_EQ(parent, symbol.parent_name_key().first);
  return symbols_by_parent_.insert(symbol).second;
}